

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O1

bool cmFLTKWrapUICommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *args,cmExecutionStatus *status)

{
  char *pcVar1;
  cmMakefile *this;
  pointer pcVar2;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var3;
  bool bVar4;
  string *psVar5;
  cmSourceFile *this_00;
  cmCustomCommand *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  string_view value;
  __single_object hcc;
  string sourceListValue;
  __single_object ccc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputDirectories;
  string outName;
  string cxxres;
  string varName;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> generatedSourcesClasses;
  string outputDirectory;
  string cdir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_288;
  undefined1 local_280 [32];
  _Head_base<0UL,_cmCustomCommand_*,_false> local_260;
  _Any_data local_258;
  undefined1 local_248 [32];
  code *local_228;
  char *pcStack_220;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_218;
  char *local_210;
  long local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  undefined1 local_1e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  string local_1a8;
  void *local_188;
  iterator iStack_180;
  cmSourceFile **local_178;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_168;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_160;
  value_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  ulong local_88;
  pointer local_80;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_78;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  uVar10 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if (uVar10 < 0x21) {
    local_258._M_unused._M_object =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_128._M_dataplus._M_p = (pointer)local_248._0_8_;
    uVar8 = local_258._M_unused._0_8_;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_258._M_unused._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248)
    goto LAB_00211891;
  }
  else {
    this = status->Makefile;
    local_88 = uVar10;
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    local_138._M_allocated_capacity = (size_type)&local_128;
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,pcVar2,pcVar2 + psVar5->_M_string_length);
    local_258._M_unused._M_object = local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"FLTK_FLUID_EXECUTABLE","")
    ;
    local_128.field_2._8_8_ = cmMakefile::GetRequiredDefinition(this,(string *)&local_258);
    if ((undefined1 *)local_258._M_unused._0_8_ != local_248) {
      operator_delete(local_258._M_unused._M_object,(ulong)(local_248._0_8_ + 1));
    }
    local_128.field_2._M_allocated_capacity =
         (size_type)
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,pcVar2,pcVar2 + psVar5->_M_string_length);
    local_258._M_unused._M_object = (cmSourceFile *)0x0;
    local_258._8_8_ = 0;
    local_248._0_8_ = (code *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_258,&local_158);
    cmMakefile::AddIncludeDirectories
              (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_258,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_258);
    local_188 = (void *)0x0;
    iStack_180._M_current = (cmSourceFile **)0x0;
    local_178 = (cmSourceFile **)0x0;
    local_80 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    psVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1;
    if (psVar5 != local_80) {
      do {
        this_00 = cmMakefile::GetSource(this,psVar5,Ambiguous);
        if (this_00 == (cmSourceFile *)0x0) {
          bVar4 = true;
        }
        else {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"WRAP_EXCLUDE","");
          bVar4 = cmSourceFile::GetPropertyAsBool(this_00,&local_c8);
          bVar4 = !bVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar4) {
          cmsys::SystemTools::GetFilenameWithoutExtension((string *)local_280,psVar5);
          local_258._M_unused._M_object = (void *)local_158._M_string_length;
          local_258._8_8_ = local_158._M_dataplus._M_p;
          local_248._0_8_ = (pointer)0x0;
          local_248._8_8_ = 1;
          local_248._16_8_ = "/";
          local_248._24_8_ = 0;
          local_228 = (code *)local_280._8_8_;
          pcStack_220 = (char *)local_280._0_8_;
          views._M_len = 3;
          views._M_array = (iterator)&local_258;
          local_218._M_head_impl = (cmCustomCommand *)local_280;
          cmCatViews((string *)local_1e8,views);
          if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
            operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
          }
          local_258._M_unused._M_object = (void *)local_1e8._8_8_;
          local_258._8_8_ = local_1e8._0_8_;
          local_248._0_8_ = (pointer)0x0;
          local_248._8_8_ = 2;
          local_248._16_8_ = ".h";
          local_248._24_8_ = 0;
          views_00._M_len = 2;
          views_00._M_array = (iterator)&local_258;
          cmCatViews((string *)local_280,views_00);
          local_258._M_unused._M_object = (void *)local_138._8_8_;
          local_258._8_8_ = local_138._M_allocated_capacity;
          local_248._0_8_ = (pointer)0x0;
          local_248._8_8_ = 1;
          local_248._16_8_ = "/";
          local_248._24_8_ = 0;
          pcStack_220 = (psVar5->_M_dataplus)._M_p;
          local_228 = (code *)psVar5->_M_string_length;
          local_218._M_head_impl = (cmCustomCommand *)0x0;
          views_01._M_len = 3;
          views_01._M_array = (iterator)&local_258;
          cmCatViews(&local_1a8,views_01);
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_a8,&local_1a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_a8,(value_type *)local_128.field_2._8_8_);
          local_258._M_unused._M_object = (void *)local_1e8._8_8_;
          local_258._8_8_ = local_1e8._0_8_;
          local_248._0_8_ = (pointer)0x0;
          local_248._8_8_ = 4;
          local_248._16_8_ = ".cxx";
          local_248._24_8_ = 0;
          views_02._M_len = 2;
          views_02._M_array = (iterator)&local_258;
          cmCatViews((string *)&local_1c8,views_02);
          local_258._8_8_ = *(undefined8 *)local_128.field_2._8_8_;
          local_258._M_unused._0_8_ = (undefined8)*(size_type *)(local_128.field_2._8_8_ + 8);
          local_248._0_8_ = (pointer)0x2;
          local_248._8_8_ = "-c";
          local_248._16_8_ = 2;
          local_248._24_8_ = "-h";
          local_228 = (code *)local_280._8_8_;
          pcStack_220 = (char *)local_280._0_8_;
          local_218._M_head_impl = (cmCustomCommand *)0x2;
          local_210 = "-o";
          local_208 = local_1c8._8_8_;
          local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_allocated_capacity;
          local_1f8 = local_1a8._M_string_length;
          local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1a8._M_dataplus._M_p;
          ilist._M_len = 7;
          ilist._M_array = (iterator)&local_258;
          cmMakeSingleCommandLine((cmCustomCommandLines *)&local_78,ilist);
          std::make_unique<cmCustomCommand>();
          _Var3._M_head_impl = local_288._M_head_impl;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&local_a8);
          cmCustomCommand::SetDepends(_Var3._M_head_impl,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          _Var3._M_head_impl = local_288._M_head_impl;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                    (&local_60,&local_78);
          cmCustomCommand::SetCommandLines(_Var3._M_head_impl,(cmCustomCommandLines *)&local_60);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_60)
          ;
          _Var3._M_head_impl = local_288._M_head_impl;
          this_01 = (cmCustomCommand *)operator_new(0x140);
          cmCustomCommand::cmCustomCommand(this_01,_Var3._M_head_impl);
          _Var3._M_head_impl = local_288._M_head_impl;
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          local_260._M_head_impl = this_01;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,local_1c8._M_allocated_capacity,
                     local_1c8._8_8_ + local_1c8._M_allocated_capacity);
          cmCustomCommand::SetOutputs(_Var3._M_head_impl,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          local_160._M_t.
          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
               local_288._M_head_impl;
          local_288._M_head_impl = (cmCustomCommand *)0x0;
          local_248._0_8_ = (code *)0x0;
          local_248._8_8_ = 0;
          local_258._M_unused._M_object = (void *)0x0;
          local_258._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (this,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                          &local_160,(CommandSourceCallback *)&local_258,false);
          if ((code *)local_248._0_8_ != (code *)0x0) {
            (*(code *)local_248._0_8_)(&local_258,&local_258,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_160);
          _Var3._M_head_impl = local_260._M_head_impl;
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,local_280._0_8_,
                     (code *)(local_280._8_8_ + local_280._0_8_));
          cmCustomCommand::SetOutputs(_Var3._M_head_impl,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          local_168._M_head_impl = local_260._M_head_impl;
          local_260._M_head_impl = (cmCustomCommand *)0x0;
          local_248._0_8_ = (code *)0x0;
          local_248._8_8_ = (code *)0x0;
          local_258._M_unused._M_object = (void *)0x0;
          local_258._8_8_ = 0;
          cmMakefile::AddCustomCommandToOutput
                    (this,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                          &local_168,(CommandSourceCallback *)&local_258,false);
          if ((code *)local_248._0_8_ != (code *)0x0) {
            (*(code *)local_248._0_8_)(&local_258,&local_258,3);
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_168);
          local_258._M_unused._M_object = cmMakefile::GetSource(this,(string *)&local_1c8,Ambiguous)
          ;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&((cmSourceFile *)local_258._M_unused._0_8_)->Depends,(value_type *)local_280)
          ;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_258._M_unused._M_function_pointer + 0x110),&local_1a8);
          if (iStack_180._M_current == local_178) {
            std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
            _M_realloc_insert<cmSourceFile*const&>
                      ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)&local_188,iStack_180,
                       (cmSourceFile **)&local_258);
          }
          else {
            *iStack_180._M_current = (cmSourceFile *)local_258._M_unused._0_8_;
            iStack_180._M_current = iStack_180._M_current + 1;
          }
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_260);
          std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                    ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                     &local_288);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_78)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_allocated_capacity != &local_1b8) {
            operator_delete((void *)local_1c8._M_allocated_capacity,
                            local_1b8._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
            operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1e8 + 0x10)) {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
          }
        }
        psVar5 = psVar5 + 1;
      } while (psVar5 != local_80);
    }
    pcVar1 = local_280 + 0x10;
    local_280._8_8_ = (code *)0x0;
    local_280[0x10] = '\0';
    local_280._0_8_ = pcVar1;
    if ((long)iStack_180._M_current - (long)local_188 != 0) {
      lVar9 = (long)iStack_180._M_current - (long)local_188 >> 3;
      lVar7 = 0;
      do {
        if (lVar7 != 0) {
          std::__cxx11::string::append(local_280);
        }
        psVar5 = cmSourceFile::ResolveFullPath
                           (*(cmSourceFile **)((long)local_188 + lVar7 * 8),(string *)0x0,
                            (string *)0x0);
        std::__cxx11::string::_M_append(local_280,(ulong)(psVar5->_M_dataplus)._M_p);
        lVar7 = lVar7 + 1;
      } while (lVar9 + (ulong)(lVar9 == 0) != lVar7);
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,*(long *)local_128.field_2._M_allocated_capacity,
               *(size_type *)(local_128.field_2._M_allocated_capacity + 8) +
               *(long *)local_128.field_2._M_allocated_capacity);
    std::__cxx11::string::append((char *)&local_1a8);
    value._M_str = (char *)local_280._0_8_;
    value._M_len = local_280._8_8_;
    cmMakefile::AddDefinition(this,&local_1a8,value);
    local_1c8._M_allocated_capacity = (size_type)&local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,*(long *)local_128.field_2._M_allocated_capacity,
               *(size_type *)(local_128.field_2._M_allocated_capacity + 8) +
               *(long *)local_128.field_2._M_allocated_capacity);
    local_1e8._16_8_ = 0;
    local_1e8._24_8_ = 0;
    local_1e8._0_8_ = (pointer)0x0;
    local_1e8._8_8_ = (void *)0x0;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    (pbVar6->_M_dataplus)._M_p = (pointer)&pbVar6->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pbVar6,local_1c8._M_allocated_capacity,
               local_1c8._8_8_ + local_1c8._M_allocated_capacity);
    local_248._8_8_ =
         std::
         _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFLTKWrapUICommand.cxx:134:5)>
         ::_M_invoke;
    local_258._8_8_ = local_1e8._8_8_;
    local_248._0_8_ =
         std::
         _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFLTKWrapUICommand.cxx:134:5)>
         ::_M_manager;
    local_1e8._16_8_ = (code *)0x0;
    local_1e8._24_8_ = 0;
    local_228 = (code *)0x0;
    pcStack_220 = (char *)0x0;
    local_248._16_8_ = 0;
    local_248._24_8_ = (char *)0x0;
    local_218._M_head_impl = (cmCustomCommand *)0x0;
    local_258._M_unused._0_8_ = (undefined8)pbVar6;
    local_1e8._0_8_ = pbVar6;
    cmMakefile::AddGeneratorAction(this,(GeneratorAction *)&local_258);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_218);
    if (local_228 != (code *)0x0) {
      (*local_228)((_Any_data *)(local_248 + 0x10),(_Any_data *)(local_248 + 0x10),__destroy_functor
                  );
    }
    if ((code *)local_248._0_8_ != (code *)0x0) {
      (*(code *)local_248._0_8_)(&local_258,&local_258,3);
    }
    if ((code *)local_1e8._16_8_ != (code *)0x0) {
      (*(code *)local_1e8._16_8_)(local_1e8,local_1e8,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_allocated_capacity != &local_1b8) {
      operator_delete((void *)local_1c8._M_allocated_capacity,local_1b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    uVar10 = local_88;
    if ((char *)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    if (local_188 != (void *)0x0) {
      operator_delete(local_188,(long)local_178 - (long)local_188);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    uVar8 = local_138._M_allocated_capacity;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_138._M_allocated_capacity == &local_128) goto LAB_00211891;
  }
  operator_delete((void *)uVar8,(ulong)((code *)local_128._M_dataplus._M_p + 1));
LAB_00211891:
  return 0x20 < uVar10;
}

Assistant:

bool cmFLTKWrapUICommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // what is the current source dir
  std::string cdir = mf.GetCurrentSourceDirectory();
  std::string const& fluid_exe =
    mf.GetRequiredDefinition("FLTK_FLUID_EXECUTABLE");

  // Target that will use the generated files
  std::string const& target = args[0];

  // get the list of GUI files from which .cxx and .h will be generated
  std::string outputDirectory = mf.GetCurrentBinaryDirectory();

  {
    // Some of the generated files are *.h so the directory "GUI"
    // where they are created have to be added to the include path
    std::vector<std::string> outputDirectories;
    outputDirectories.push_back(outputDirectory);
    mf.AddIncludeDirectories(outputDirectories);
  }

  // List of produced files.
  std::vector<cmSourceFile*> generatedSourcesClasses;

  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    cmSourceFile* curr = mf.GetSource(arg);
    // if we should use the source GUI
    // to generate .cxx and .h files
    if (!curr || !curr->GetPropertyAsBool("WRAP_EXCLUDE")) {
      std::string outName = cmStrCat(
        outputDirectory, "/", cmSystemTools::GetFilenameWithoutExtension(arg));
      std::string hname = cmStrCat(outName, ".h");
      std::string origname = cmStrCat(cdir, "/", arg);
      // add starting depends
      std::vector<std::string> depends;
      depends.push_back(origname);
      depends.push_back(fluid_exe);
      std::string cxxres = cmStrCat(outName, ".cxx");

      cmCustomCommandLines commandLines = cmMakeSingleCommandLine({
        fluid_exe,
        "-c", // instructs Fluid to run in command line
        "-h", // optionally rename .h files
        hname,
        "-o", // optionally rename .cxx files
        cxxres,
        origname // name of the GUI fluid file
      });

      // Add command for generating the .h and .cxx files

      auto hcc = cm::make_unique<cmCustomCommand>();
      hcc->SetDepends(depends);
      hcc->SetCommandLines(commandLines);
      auto ccc = cm::make_unique<cmCustomCommand>(*hcc);

      hcc->SetOutputs(cxxres);
      mf.AddCustomCommandToOutput(std::move(hcc));

      ccc->SetOutputs(hname);
      mf.AddCustomCommandToOutput(std::move(ccc));

      cmSourceFile* sf = mf.GetSource(cxxres);
      sf->AddDepend(hname);
      sf->AddDepend(origname);
      generatedSourcesClasses.push_back(sf);
    }
  }

  // create the variable with the list of sources in it
  size_t lastHeadersClass = generatedSourcesClasses.size();
  std::string sourceListValue;
  for (size_t classNum = 0; classNum < lastHeadersClass; classNum++) {
    if (classNum) {
      sourceListValue += ";";
    }
    sourceListValue += generatedSourcesClasses[classNum]->ResolveFullPath();
  }

  std::string const varName = target + "_FLTK_UI_SRCS";
  mf.AddDefinition(varName, sourceListValue);

  mf.AddGeneratorAction(
    [target](cmLocalGenerator& lg, const cmListFileBacktrace& lfbt) {
      FinalAction(*lg.GetMakefile(), target, lfbt);
    });
  return true;
}